

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO.h
# Opt level: O3

ostream * Eigen::internal::print_matrix<Eigen::Matrix<double,_1,_1,0,_1,_1>>
                    (ostream *s,Matrix<double,__1,__1,_0,__1,__1> *_m,IOFormat *fmt)

{
  ostream oVar1;
  int iVar2;
  ostream *poVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long local_208;
  stringstream sstr;
  ios_base local_188 [264];
  long *local_80;
  long local_78;
  long local_70 [2];
  Matrix<double,__1,__1,_0,__1,__1> *local_60;
  long local_58;
  undefined8 local_50;
  long local_48;
  long local_40;
  undefined4 local_38;
  ostream local_31;
  
  lVar4 = (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  lVar6 = (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (lVar6 == 0 || lVar4 == 0) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (s,(fmt->matPrefix)._M_dataplus._M_p,(fmt->matPrefix)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar3,(fmt->matSuffix)._M_dataplus._M_p,(fmt->matSuffix)._M_string_length);
    return s;
  }
  iVar2 = fmt->precision;
  lVar5 = (long)iVar2;
  if (lVar5 == -2) {
    lVar5 = 0xf;
  }
  else if ((iVar2 == -1) || (iVar2 == 0)) {
    local_38 = (undefined4)CONCAT71((int7)(int3)((uint)iVar2 >> 8),1);
    local_50 = 0;
    goto LAB_00120693;
  }
  local_50 = *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8);
  *(long *)(s + *(long *)(*(long *)s + -0x18) + 8) = lVar5;
  lVar6 = (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_38 = 0;
LAB_00120693:
  if (lVar6 < 1 || (fmt->flags & 1) != 0) {
    local_48 = 0;
  }
  else {
    local_40 = 0;
    local_58 = 0;
    local_48 = 0;
    do {
      if (0 < lVar4) {
        lVar6 = 0;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)&local_208);
          std::ios::copyfmt((ios *)((stringstream *)&local_208 + *(long *)(local_208 + -0x18)));
          std::ostream::_M_insert<double>
                    (*(double *)
                      ((long)(_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_data +
                      lVar6 * 8 +
                      (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_rows * local_40));
          std::__cxx11::stringbuf::str();
          if (local_48 <= local_78) {
            local_48 = local_78;
          }
          if (local_80 != local_70) {
            operator_delete(local_80,local_70[0] + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)&local_208);
          std::ios_base::~ios_base(local_188);
          lVar6 = lVar6 + 1;
          lVar4 = (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                  m_rows;
        } while (lVar6 < lVar4);
        lVar6 = (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_cols;
      }
      local_58 = local_58 + 1;
      local_40 = local_40 + 8;
    } while (local_58 < lVar6);
  }
  lVar4 = *(long *)(*(long *)s + -0x18);
  poVar3 = s + lVar4;
  local_58 = *(long *)(s + lVar4 + 0x10);
  if (s[lVar4 + 0xe1] == (ostream)0x1) {
    local_31 = poVar3[0xe0];
  }
  else {
    local_31 = (ostream)std::ios::widen((char)poVar3);
    poVar3[0xe0] = local_31;
    poVar3[0xe1] = (ostream)0x1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (s,(fmt->matPrefix)._M_dataplus._M_p,(fmt->matPrefix)._M_string_length);
  lVar4 = local_48;
  if (0 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows) {
    lVar6 = 0;
    local_60 = _m;
    do {
      if (lVar6 != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (s,(fmt->rowSpacer)._M_dataplus._M_p,(fmt->rowSpacer)._M_string_length);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (s,(fmt->rowPrefix)._M_dataplus._M_p,(fmt->rowPrefix)._M_string_length);
      local_40 = lVar6;
      if (lVar4 != 0) {
        lVar4 = *(long *)s;
        poVar3 = s + *(long *)(lVar4 + -0x18);
        oVar1 = (ostream)fmt->fill;
        if (s[*(long *)(lVar4 + -0x18) + 0xe1] == (ostream)0x0) {
          std::ios::widen((char)poVar3);
          poVar3[0xe1] = (ostream)0x1;
          lVar4 = *(long *)s;
        }
        poVar3[0xe0] = oVar1;
        *(long *)(s + *(long *)(lVar4 + -0x18) + 0x10) = local_48;
        lVar4 = local_48;
      }
      std::ostream::_M_insert<double>
                ((_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data[local_40]);
      if (1 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_cols) {
        lVar6 = 1;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    (s,(fmt->coeffSeparator)._M_dataplus._M_p,(fmt->coeffSeparator)._M_string_length
                    );
          if (lVar4 != 0) {
            lVar4 = *(long *)s;
            poVar3 = s + *(long *)(lVar4 + -0x18);
            oVar1 = (ostream)fmt->fill;
            if (s[*(long *)(lVar4 + -0x18) + 0xe1] == (ostream)0x0) {
              std::ios::widen((char)poVar3);
              poVar3[0xe1] = (ostream)0x1;
              lVar4 = *(long *)s;
            }
            poVar3[0xe0] = oVar1;
            *(long *)(s + *(long *)(lVar4 + -0x18) + 0x10) = local_48;
            lVar4 = local_48;
            _m = local_60;
          }
          std::ostream::_M_insert<double>
                    ((_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                     m_storage.m_data
                     [(_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_rows * lVar6 + local_40]);
          lVar6 = lVar6 + 1;
        } while (lVar6 < (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                         m_storage.m_cols);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (s,(fmt->rowSuffix)._M_dataplus._M_p,(fmt->rowSuffix)._M_string_length);
      lVar6 = local_40;
      lVar5 = (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
              m_rows;
      if (local_40 < lVar5 + -1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (s,(fmt->rowSeparator)._M_dataplus._M_p,(fmt->rowSeparator)._M_string_length);
        lVar5 = (_m->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_rows;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < lVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (s,(fmt->matSuffix)._M_dataplus._M_p,(fmt->matSuffix)._M_string_length);
  if ((char)local_38 == '\0') {
    *(undefined8 *)(s + *(long *)(*(long *)s + -0x18) + 8) = local_50;
  }
  if (lVar4 != 0) {
    lVar4 = *(long *)s;
    poVar3 = s + *(long *)(lVar4 + -0x18);
    if (s[*(long *)(lVar4 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar3);
      poVar3[0xe1] = (ostream)0x1;
      lVar4 = *(long *)s;
    }
    poVar3[0xe0] = local_31;
    *(long *)(s + *(long *)(lVar4 + -0x18) + 0x10) = local_58;
  }
  return s;
}

Assistant:

std::ostream & print_matrix(std::ostream & s, const Derived& _m, const IOFormat& fmt)
{
  using internal::is_same;
  using internal::conditional;

  if(_m.size() == 0)
  {
    s << fmt.matPrefix << fmt.matSuffix;
    return s;
  }
  
  typename Derived::Nested m = _m;
  typedef typename Derived::Scalar Scalar;
  typedef typename
      conditional<
          is_same<Scalar, char>::value ||
            is_same<Scalar, unsigned char>::value ||
            is_same<Scalar, numext::int8_t>::value ||
            is_same<Scalar, numext::uint8_t>::value,
          int,
          typename conditional<
              is_same<Scalar, std::complex<char> >::value ||
                is_same<Scalar, std::complex<unsigned char> >::value ||
                is_same<Scalar, std::complex<numext::int8_t> >::value ||
                is_same<Scalar, std::complex<numext::uint8_t> >::value,
              std::complex<int>,
              const Scalar&
            >::type
        >::type PrintType;

  Index width = 0;

  std::streamsize explicit_precision;
  if(fmt.precision == StreamPrecision)
  {
    explicit_precision = 0;
  }
  else if(fmt.precision == FullPrecision)
  {
    if (NumTraits<Scalar>::IsInteger)
    {
      explicit_precision = 0;
    }
    else
    {
      explicit_precision = significant_decimals_impl<Scalar>::run();
    }
  }
  else
  {
    explicit_precision = fmt.precision;
  }

  std::streamsize old_precision = 0;
  if(explicit_precision) old_precision = s.precision(explicit_precision);

  bool align_cols = !(fmt.flags & DontAlignCols);
  if(align_cols)
  {
    // compute the largest width
    for(Index j = 0; j < m.cols(); ++j)
      for(Index i = 0; i < m.rows(); ++i)
      {
        std::stringstream sstr;
        sstr.copyfmt(s);
        sstr << static_cast<PrintType>(m.coeff(i,j));
        width = std::max<Index>(width, Index(sstr.str().length()));
      }
  }
  std::streamsize old_width = s.width();
  char old_fill_character = s.fill();
  s << fmt.matPrefix;
  for(Index i = 0; i < m.rows(); ++i)
  {
    if (i)
      s << fmt.rowSpacer;
    s << fmt.rowPrefix;
    if(width) {
      s.fill(fmt.fill);
      s.width(width);
    }
    s << static_cast<PrintType>(m.coeff(i, 0));
    for(Index j = 1; j < m.cols(); ++j)
    {
      s << fmt.coeffSeparator;
      if(width) {
        s.fill(fmt.fill);
        s.width(width);
      }
      s << static_cast<PrintType>(m.coeff(i, j));
    }
    s << fmt.rowSuffix;
    if( i < m.rows() - 1)
      s << fmt.rowSeparator;
  }
  s << fmt.matSuffix;
  if(explicit_precision) s.precision(old_precision);
  if(width) {
    s.fill(old_fill_character);
    s.width(old_width);
  }
  return s;
}